

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O1

int linfload(osfildef *fp,dbgcxdef *dbgctx,errcxdef *ec,tokpdef *path)

{
  size_t sVar1;
  linfdef *plVar2;
  uchar *__ptr;
  char *pcVar3;
  int iVar4;
  mcmon *nump;
  uchar buf [261];
  byte local_138;
  byte local_137;
  uint local_136;
  char local_132 [266];
  
  sVar1 = fread(&local_138,6,1,(FILE *)fp);
  if (sVar1 == 1) {
    sVar1 = fread(local_132,(ulong)local_137,1,(FILE *)fp);
    if (sVar1 == 1) {
      plVar2 = linfini(dbgctx->dbgcxmem,ec,local_132,(uint)local_137,path,0,0);
      if (plVar2 == (linfdef *)0x0) {
        pcVar3 = errstr(ec,local_132,(uint)local_137);
        ec->errcxptr->erraav[0].errastr = pcVar3;
        ec->errcxptr->erraac = 1;
        errlogn(ec,0x7db,"TADS");
      }
      else {
        if ((FILE *)plVar2->linffp != (FILE *)0x0) {
          fclose((FILE *)plVar2->linffp);
          plVar2->linffp = (osfildef *)0x0;
        }
        (plVar2->linflin).linnxt = dbgctx->dbgcxlin;
        dbgctx->dbgcxlin = &plVar2->linflin;
        (plVar2->linflin).linid = (uint)local_138;
        plVar2->linfcrec = (ulong)local_136;
        if (dbgctx->dbgcxfid <= (int)(uint)local_138) {
          dbgctx->dbgcxfid = local_138 + 1;
        }
        if (plVar2->linfcrec == 0) {
          return 0;
        }
        iVar4 = (int)(plVar2->linfcrec - 1 >> 10) + 1;
        if (iVar4 == 0) {
          return 0;
        }
        nump = plVar2->linfpg;
        while( true ) {
          __ptr = mcmalo0(plVar2->linfmem,0x1000,nump,0xffff,0);
          sVar1 = fread(__ptr,0x1000,1,(FILE *)fp);
          if (sVar1 != 1) break;
          mcmunlck(plVar2->linfmem,*nump);
          nump = nump + 1;
          iVar4 = iVar4 + -1;
          if (iVar4 == 0) {
            return 0;
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int linfload(osfildef *fp, dbgcxdef *dbgctx, errcxdef *ec, tokpdef *path)
{
    linfdef *linf;
    uchar    buf[UCHAR_MAX + 6];
    uint     pgcnt;
    uchar   *objp;
    mcmon   *objn;
    
    /* read the source's description from the file */
    if (osfrb(fp, buf, 6)
        || osfrb(fp, buf + 6, (int)buf[1]))
        return TRUE;
    
    /* initialize the linfdef */
    if (!(linf = linfini(dbgctx->dbgcxmem, ec, (char *)buf + 6,
                         (int)buf[1], path, FALSE, FALSE)))
    {
        errlog1(ec, ERR_NOSOURC, ERRTSTR,
                errstr(ec, (char *)buf+6, (int)buf[1]));
        return TRUE;
    }
    
    /* if we opened the file, close it - don't hold all files open */
    if (linf->linffp != 0)
    {
        osfcls(linf->linffp);
        linf->linffp = 0;
    }
    
    /* link into debug line source chain */
    linf->linflin.linnxt = dbgctx->dbgcxlin;
    dbgctx->dbgcxlin = &linf->linflin;
    linf->linflin.linid = buf[0];
    linf->linfcrec = osrp4(buf + 2);
    
    /* make sure the max line id is set above current line */
    if (buf[0] >= dbgctx->dbgcxfid)
        dbgctx->dbgcxfid = buf[0] + 1;
    
    /* make sure we have some debug records */
    if (!linf->linfcrec)
        return FALSE;

    /* figure number of pages */
    pgcnt = 1 + ((linf->linfcrec - 1) >> 10);
    
    /* allocate and read the debug source pages */
    for (objn = linf->linfpg ; pgcnt ; ++objn, --pgcnt)
    {
        objp = mcmalo(linf->linfmem, (ushort)(1024 * DBGLINFSIZ), objn);
        if (osfrb(fp, objp, (1024 * DBGLINFSIZ))) return(TRUE);
        mcmunlck(linf->linfmem, *objn);
    }

    /* success */
    return FALSE;
}